

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r20_conv.cpp
# Opt level: O0

precise_unit units::r20_unit(string *r20_string)

{
  char *__s1;
  precise_unit pVar1;
  int iVar2;
  const_iterator pvVar3;
  const_iterator pvVar4;
  tuple<const_char_*,_const_char_*,_units::precise_unit> *__t;
  __tuple_element_t<0UL,_tuple<const_char_*,_const_char_*,_precise_unit>_> *ppcVar5;
  char *__s2;
  __tuple_element_t<2UL,_tuple<const_char_*,_const_char_*,_precise_unit>_> *p_Var6;
  tuple<const_char_*,_const_char_*,_units::precise_unit> *ind;
  string *r20_string_local;
  undefined8 local_10;
  
  pvVar3 = std::array<std::tuple<const_char_*,_const_char_*,_units::precise_unit>,_2088UL>::begin
                     ((array<std::tuple<const_char_*,_const_char_*,_units::precise_unit>,_2088UL> *)
                      precise::r20_units);
  pvVar4 = std::array<std::tuple<const_char_*,_const_char_*,_units::precise_unit>,_2088UL>::end
                     ((array<std::tuple<const_char_*,_const_char_*,_units::precise_unit>,_2088UL> *)
                      precise::r20_units);
  __t = std::
        lower_bound<std::tuple<char_const*,char_const*,units::precise_unit>const*,std::__cxx11::string,units::r20_unit(std::__cxx11::string_const&)::__0>
                  (pvVar3,pvVar4,r20_string);
  pvVar3 = std::array<std::tuple<const_char_*,_const_char_*,_units::precise_unit>,_2088UL>::end
                     ((array<std::tuple<const_char_*,_const_char_*,_units::precise_unit>,_2088UL> *)
                      precise::r20_units);
  if (__t == pvVar3) {
    r20_string_local = (string *)0x7ff4000000000000;
    local_10 = 0xfa94a488;
  }
  else {
    ppcVar5 = std::get<0ul,char_const*,char_const*,units::precise_unit>(__t);
    __s1 = *ppcVar5;
    __s2 = (char *)std::__cxx11::string::c_str();
    iVar2 = strcmp(__s1,__s2);
    if (iVar2 == 0) {
      p_Var6 = std::get<2ul,char_const*,char_const*,units::precise_unit>(__t);
      r20_string_local = (string *)p_Var6->multiplier_;
      local_10._0_4_ = p_Var6->base_units_;
      local_10._4_4_ = p_Var6->commodity_;
    }
    else {
      r20_string_local = (string *)0x7ff4000000000000;
      local_10 = 0xfa94a488;
    }
  }
  pVar1.base_units_ = (unit_data)(undefined4)local_10;
  pVar1.commodity_ = local_10._4_4_;
  pVar1.multiplier_ = (double)r20_string_local;
  return pVar1;
}

Assistant:

precise_unit r20_unit(const std::string& r20_string)
{
    // NOLINTNEXTLINE (readability-qualified-auto)
    auto ind = std::lower_bound(
        precise::r20_units.begin(),
        precise::r20_units.end(),
        r20_string,
        [](const precise::unitD& u_set, const std::string& val) {
            return (strcmp(std::get<0>(u_set), val.c_str()) < 0);
        });
    if (ind == precise::r20_units.end()) {
        return precise::invalid;
    }
    if (strcmp(std::get<0>(*ind), r20_string.c_str()) == 0) {
        return std::get<2>(*ind);
    }
    return precise::invalid;
}